

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bimap.cpp
# Opt level: O0

void __thiscall BiMap_Present_Test::~BiMap_Present_Test(BiMap_Present_Test *this)

{
  BiMap_Present_Test *this_local;
  
  ~BiMap_Present_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BiMap, Present) {
    pstore::broker::bimap<std::string, int> bm;
    bm.set ("a", 42);
    bm.set ("b", 37);
    EXPECT_FALSE (bm.presentl ("false"));
    EXPECT_TRUE (bm.presentl ("a"));
    EXPECT_FALSE (bm.presentr (0));
    EXPECT_TRUE (bm.presentr (42));
}